

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view input,
          bool lower_first)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  Nonnull<const_char_*> failure_msg;
  uint uVar4;
  _anonymous_namespace_ *p_Var5;
  char local_4c;
  LogMessageFatal local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this != (_anonymous_namespace_ *)0x0) {
    uVar4 = (uint)input._M_str ^ 1;
    p_Var5 = (_anonymous_namespace_ *)0x0;
    do {
      uVar2 = 1;
      if (p_Var5[input._M_len] != (_anonymous_namespace_)0x5f) {
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          uVar2 = uVar4;
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          uVar2 = 0;
        }
      }
      uVar4 = uVar2;
      p_Var5 = p_Var5 + 1;
    } while (this != p_Var5);
  }
  local_4c = (char)input._M_str;
  if ((local_4c != '\0') && (__return_storage_ptr__->_M_string_length != 0)) {
    pbVar1 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    *pbVar1 = absl::lts_20250127::ascii_internal::kToLower[*pbVar1];
  }
  if (this == (_anonymous_namespace_ *)0x0) {
    lVar3 = 0;
  }
  else {
    p_Var5 = (_anonymous_namespace_ *)0x0;
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (ulong)(p_Var5[input._M_len] == (_anonymous_namespace_)0x5f);
      p_Var5 = p_Var5 + 1;
    } while (this != p_Var5);
  }
  if ((long)this - lVar3 == __return_storage_ptr__->_M_string_length) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                            ((long)this - lVar3,__return_storage_ptr__->_M_string_length,
                             "CamelCaseSize(input) == result.size()");
  }
  if (failure_msg != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x7f,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToCamelCase(const absl::string_view input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(absl::ascii_toupper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = absl::ascii_tolower(result[0]);
  }

  ABSL_DCHECK_EQ(CamelCaseSize(input), result.size());

  return result;
}